

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Data * __thiscall
QTzTimeZonePrivate::data(Data *__return_storage_ptr__,QTzTimeZonePrivate *this,TimeType timeType)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined3 uVar3;
  difference_type __d;
  qint64 forMSecsSinceEpoch;
  ulong uVar4;
  ulong uVar5;
  QTzTransitionTime *pQVar6;
  long in_FS_OFFSET;
  QTzTransitionTime tran_00;
  Data tran;
  Data local_98;
  undefined1 local_68 [40];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  forMSecsSinceEpoch = QDateTime::currentMSecsSinceEpoch();
  local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data((Data *)local_68,this,forMSecsSinceEpoch);
  if ((timeType == DaylightTime) == ((int)puStack_40 == 0)) {
    nextTransition(&local_98,this,forMSecsSinceEpoch);
    QTimeZonePrivate::Data::operator=((Data *)local_68,&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    if (((undefined1 *)local_68._24_8_ == (undefined1 *)0x8000000000000000) ||
       ((timeType == DaylightTime) == ((int)puStack_40 == 0))) {
      previousTransition(&local_98,this,forMSecsSinceEpoch + 1);
      QTimeZonePrivate::Data::operator=((Data *)local_68,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      if ((undefined1 *)local_68._24_8_ != (undefined1 *)0x8000000000000000) {
        previousTransition(&local_98,this,local_68._24_8_);
        QTimeZonePrivate::Data::operator=((Data *)local_68,&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        if (((undefined1 *)local_68._24_8_ != (undefined1 *)0x8000000000000000) &&
           ((timeType == DaylightTime) != ((int)puStack_40 == 0))) goto LAB_003b35dd;
      }
      pQVar6 = (this->cached_data).m_tranTimes.d.ptr;
      uVar4 = (this->cached_data).m_tranTimes.d.size;
      while (uVar5 = uVar4, 0 < (long)uVar5) {
        uVar4 = uVar5 >> 1;
        if (pQVar6[uVar4].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
          pQVar6 = pQVar6 + uVar4 + 1;
          uVar4 = ~uVar4 + uVar5;
        }
      }
      do {
        if (pQVar6 == (this->cached_data).m_tranTimes.d.ptr) {
          (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
          (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
          (__return_storage_ptr__->abbreviation).d.size = 0;
          __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
          __return_storage_ptr__->offsetFromUtc = -0x80000000;
          __return_storage_ptr__->standardTimeOffset = -0x80000000;
          __return_storage_ptr__->daylightTimeOffset = -0x80000000;
          goto LAB_003b361a;
        }
        uVar1 = pQVar6[-1].atMSecsSinceEpoch;
        uVar2 = pQVar6[-1].ruleIndex;
        uVar3 = *(undefined3 *)&pQVar6[-1].field_0x9;
        tran_00._9_3_ = uVar3;
        tran_00.ruleIndex = uVar2;
        tran_00.atMSecsSinceEpoch = uVar1;
        tran_00._12_4_ = 0;
        dataForTzTransition(&local_98,this,tran_00);
        QTimeZonePrivate::Data::operator=((Data *)local_68,&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        pQVar6 = pQVar6 + -1;
      } while (((int)puStack_40 != 0) != (timeType == DaylightTime));
    }
  }
LAB_003b35dd:
  QTimeZonePrivate::Data::Data(__return_storage_ptr__,(Data *)local_68);
LAB_003b361a:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(QTimeZone::TimeType timeType) const
{
    // True if tran is valid and has the DST-ness to match timeType:
    const auto validMatch = [timeType](const Data &tran) {
        return tran.atMSecsSinceEpoch != invalidMSecs()
            && ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0));
    };

    // Get current tran, use if suitable:
    const qint64 currentMSecs = QDateTime::currentMSecsSinceEpoch();
    Data tran = data(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Otherwise, next tran probably flips DST-ness:
    tran = nextTransition(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Failing that, prev (or present, if current MSecs is eactly a transition
    // moment) tran defines what data() got us and the one before that probably
    // flips DST-ness:
    tran = previousTransition(currentMSecs + 1);
    if (tran.atMSecsSinceEpoch != invalidMSecs())
        tran = previousTransition(tran.atMSecsSinceEpoch);
    if (validMatch(tran))
        return tran;

    // Otherwise, we can look backwards through transitions for a match; if we
    // have a POSIX rule, it clearly doesn't do DST (or we'd have hit it by
    // now), so we only need to look in the tranCache() up to now.
    const auto untilNow = [currentMSecs](QTzTransitionTime at) {
        return at.atMSecsSinceEpoch <= currentMSecs;
    };
    auto it = std::partition_point(tranCache().cbegin(), tranCache().cend(), untilNow);
    // That's the end or first future transition; we don't want to look at it,
    // but at all those before it.
    while (it != tranCache().cbegin()) {
        --it;
        tran = dataForTzTransition(*it);
        if ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0))
            return tran;
    }

    return {};
}